

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmargins.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *s,QMarginsF *m)

{
  QDataStream *f;
  QMarginsF *in_RSI;
  QDataStream *in_RDI;
  QDataStream *this;
  double in_stack_ffffffffffffffe8;
  
  this = in_RDI;
  QMarginsF::left(in_RSI);
  QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QMarginsF::top(in_RSI);
  QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QMarginsF::right(in_RSI);
  f = QDataStream::operator<<(this,in_stack_ffffffffffffffe8);
  QMarginsF::bottom(in_RSI);
  QDataStream::operator<<(this,(double)f);
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QMarginsF &m)
{
    s << double(m.left()) << double(m.top()) << double(m.right()) << double(m.bottom());
    return s;
}